

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O0

string * google::protobuf::internal::anon_unknown_3::GetTypeUrl
                   (string *__return_storage_ptr__,Descriptor *message,string *type_url_prefix)

{
  ulong uVar1;
  char *pcVar2;
  string *__rhs;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *type_url_prefix_local;
  Descriptor *message_local;
  
  local_20 = type_url_prefix;
  type_url_prefix_local = (string *)message;
  message_local = (Descriptor *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  psVar3 = local_20;
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::size();
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)psVar3);
    psVar3 = local_20;
    if (*pcVar2 == '/') {
      __rhs = Descriptor::full_name_abi_cxx11_((Descriptor *)type_url_prefix_local);
      std::operator+(__return_storage_ptr__,psVar3,__rhs);
      return __return_storage_ptr__;
    }
  }
  std::operator+(&local_40,local_20,"/");
  psVar3 = Descriptor::full_name_abi_cxx11_((Descriptor *)type_url_prefix_local);
  std::operator+(__return_storage_ptr__,&local_40,psVar3);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string GetTypeUrl(const Descriptor* message,
                  const string& type_url_prefix) {
  if (!type_url_prefix.empty() &&
      type_url_prefix[type_url_prefix.size() - 1] == '/') {
    return type_url_prefix + message->full_name();
  } else {
    return type_url_prefix + "/" + message->full_name();
  }
}